

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::Read
          (PosixRandomAccessFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  int *piVar1;
  char *in_R9;
  size_t local_a0;
  Status local_70;
  Slice local_68 [2];
  size_t local_48;
  ssize_t r;
  char *local_38;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  uint64_t offset_local;
  PosixRandomAccessFile *this_local;
  Status *s;
  
  r._7_1_ = 0;
  local_38 = in_R9;
  scratch_local = scratch;
  result_local = result;
  n_local = n;
  offset_local = offset;
  this_local = this;
  Status::Status((Status *)this);
  local_48 = pread(*(int *)(offset + 0x28),local_38,(size_t)result_local,n_local);
  local_a0 = local_48;
  if ((long)local_48 < 0) {
    local_a0 = 0;
  }
  Slice::Slice(local_68,local_38,local_a0);
  *(char **)scratch_local = local_68[0].data_;
  *(size_t *)(scratch_local + 8) = local_68[0].size_;
  if ((long)local_48 < 0) {
    piVar1 = __errno_location();
    IOError((anon_unknown_1 *)&local_70,(string *)(offset + 8),*piVar1);
    Status::operator=((Status *)this,&local_70);
    Status::~Status(&local_70);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Read(uint64_t offset, size_t n, Slice *result,
                                char *scratch) const {
                Status s;
                ssize_t r = pread(fd_, scratch, n, static_cast<off_t>(offset));
                *result = Slice(scratch, (r < 0) ? 0 : r);
                if (r < 0) {
                    // An error: return a non-ok status
                    s = IOError(filename_, errno);
                }
                return s;
            }